

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryInputGeometryShaderTests.cpp
# Opt level: O1

TestInstance * __thiscall
vkt::geometry::anon_unknown_2::TriangleStripAdjacencyVertexCountTest::createInstance
          (TriangleStripAdjacencyVertexCountTest *this,Context *context)

{
  int iVar1;
  GeometryExpanderRenderTestInstance *this_00;
  
  this_00 = (GeometryExpanderRenderTestInstance *)operator_new(0x70);
  iVar1 = this->m_numInputVertices;
  GeometryExpanderRenderTestInstance::GeometryExpanderRenderTestInstance
            (this_00,context,(this->super_GeometryExpanderRenderTest).m_primitiveType,
             (this->super_GeometryExpanderRenderTest).super_TestCase.super_TestCase.super_TestNode.
             m_name._M_dataplus._M_p);
  (this_00->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__GeometryExpanderRenderTestInstance_00d49130;
  GeometryInputTestInstance::genVertexAttribData((GeometryInputTestInstance *)this_00);
  this_00->m_numDrawVertices = iVar1;
  return &this_00->super_TestInstance;
}

Assistant:

TestInstance* TriangleStripAdjacencyVertexCountTest::createInstance (Context& context) const
{
	return new GeometryInputTestInstance(context, m_primitiveType, getName(), m_numInputVertices);
}